

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex
          (NearestNeighborsIndex *this,NearestNeighborsIndex *from)

{
  void *pvVar1;
  SingleKdTreeIndex *this_00;
  SingleKdTreeIndex *from_00;
  LinearIndex *this_01;
  LinearIndex *from_01;
  SquaredEuclideanDistance *this_02;
  SquaredEuclideanDistance *from_02;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NearestNeighborsIndex_00393ee0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::RepeatedPtrField
            (&this->floatsamples_,&from->floatsamples_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->numberofdimensions_ = from->numberofdimensions_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 100) {
    this_01 = mutable_linearindex(this);
    from_01 = linearindex(from);
    LinearIndex::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0x6e) {
    this_00 = mutable_singlekdtreeindex(this);
    from_00 = singlekdtreeindex(from);
    SingleKdTreeIndex::MergeFrom(this_00,from_00);
  }
  this->_oneof_case_[1] = 0;
  if (from->_oneof_case_[1] == 200) {
    this_02 = mutable_squaredeuclideandistance(this);
    from_02 = squaredeuclideandistance(from);
    SquaredEuclideanDistance::MergeFrom(this_02,from_02);
  }
  return;
}

Assistant:

NearestNeighborsIndex::NearestNeighborsIndex(const NearestNeighborsIndex& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      floatsamples_(from.floatsamples_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  numberofdimensions_ = from.numberofdimensions_;
  clear_has_IndexType();
  switch (from.IndexType_case()) {
    case kLinearIndex: {
      mutable_linearindex()->::CoreML::Specification::LinearIndex::MergeFrom(from.linearindex());
      break;
    }
    case kSingleKdTreeIndex: {
      mutable_singlekdtreeindex()->::CoreML::Specification::SingleKdTreeIndex::MergeFrom(from.singlekdtreeindex());
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  clear_has_DistanceFunction();
  switch (from.DistanceFunction_case()) {
    case kSquaredEuclideanDistance: {
      mutable_squaredeuclideandistance()->::CoreML::Specification::SquaredEuclideanDistance::MergeFrom(from.squaredeuclideandistance());
      break;
    }
    case DISTANCEFUNCTION_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NearestNeighborsIndex)
}